

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bytevector.c
# Opt level: O0

sexp_conflict
sexp_bytevector_s8_set_x_stub
          (sexp_conflict ctx,sexp_conflict self,sexp_sint_t n,sexp_conflict arg0,sexp_conflict arg1,
          sexp_conflict arg2)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  int *in_RCX;
  long lVar5;
  undefined8 in_RSI;
  undefined8 in_RDI;
  int *in_R8;
  int *in_R9;
  sexp_conflict res;
  char local_90;
  char local_88;
  int local_78;
  int local_70;
  ulong local_60;
  ulong local_58;
  long local_50;
  long local_48;
  sexp_conflict local_8;
  
  if ((((ulong)in_RCX & 3) == 0) && (*in_RCX == 8)) {
    if ((((ulong)in_R8 & 1) == 1) || ((((ulong)in_R8 & 3) == 0 && (*in_R8 == 0xc)))) {
      if ((((ulong)in_R9 & 1) == 1) || ((((ulong)in_R9 & 3) == 0 && (*in_R9 == 0xc)))) {
        lVar5 = (long)in_R8 >> 0x3f;
        if (((ulong)in_R8 & 1) == 1) {
          auVar1._8_8_ = lVar5;
          auVar1._0_8_ = (ulong)in_R8 & 0xfffffffffffffffe;
          local_48 = SUB168(auVar1 / SEXT816(2),0);
        }
        else {
          if ((((ulong)in_R8 & 3) == 0) && (*in_R8 == 0xc)) {
            local_50 = (long)(char)in_R8[2] * *(long *)(in_R8 + 6);
          }
          else {
            local_50 = 0;
          }
          local_48 = local_50;
        }
        if (-1 < local_48) {
          if (((ulong)in_R8 & 1) == 1) {
            auVar2._8_8_ = lVar5;
            auVar2._0_8_ = (ulong)in_R8 & 0xfffffffffffffffe;
            local_58 = SUB168(auVar2 / SEXT816(2),0);
          }
          else {
            if ((((ulong)in_R8 & 3) == 0) && (*in_R8 == 0xc)) {
              local_60 = (long)(char)in_R8[2] * *(long *)(in_R8 + 6);
            }
            else {
              local_60 = 0;
            }
            local_58 = local_60;
          }
          if (local_58 < *(ulong *)(in_RCX + 2)) {
            if (((ulong)in_R8 & 1) == 1) {
              auVar3._8_8_ = lVar5;
              auVar3._0_8_ = (ulong)in_R8 & 0xfffffffffffffffe;
              local_70 = SUB164(auVar3 / SEXT816(2),0);
            }
            else {
              if ((((ulong)in_R8 & 3) == 0) && (*in_R8 == 0xc)) {
                local_78 = (int)(char)in_R8[2] * (int)*(undefined8 *)(in_R8 + 6);
              }
              else {
                local_78 = 0;
              }
              local_70 = local_78;
            }
            if (((ulong)in_R9 & 1) == 1) {
              auVar4._8_8_ = (long)in_R9 >> 0x3f;
              auVar4._0_8_ = (ulong)in_R9 & 0xfffffffffffffffe;
              local_88 = SUB161(auVar4 / SEXT816(2),0);
            }
            else {
              if ((((ulong)in_R9 & 3) == 0) && (*in_R9 == 0xc)) {
                local_90 = (char)in_R9[2] * (char)*(undefined8 *)(in_R9 + 6);
              }
              else {
                local_90 = '\0';
              }
              local_88 = local_90;
            }
            bytevector_s8_set_x((char *)(in_RCX + 4),local_70,local_88);
            return (sexp_conflict)0x43e;
          }
        }
        local_8 = (sexp_conflict)
                  sexp_user_exception_ls
                            (in_RDI,in_RSI,"assertion failed: (< -1 arg1 (bytevector-length arg0))",
                             2,in_R8,*(long *)(in_RCX + 2) << 1 | 1);
      }
      else {
        local_8 = (sexp_conflict)sexp_type_exception(in_RDI,in_RSI,2,in_R9);
      }
    }
    else {
      local_8 = (sexp_conflict)sexp_type_exception(in_RDI,in_RSI,2,in_R8);
    }
  }
  else {
    local_8 = (sexp_conflict)sexp_type_exception(in_RDI,in_RSI,8,in_RCX);
  }
  return local_8;
}

Assistant:

sexp sexp_bytevector_s8_set_x_stub (sexp ctx, sexp self, sexp_sint_t n, sexp arg0, sexp arg1, sexp arg2) {
  sexp res;
  if (! sexp_bytesp(arg0))
    return sexp_type_exception(ctx, self, SEXP_BYTES, arg0);
  if (! sexp_exact_integerp(arg1))
    return sexp_type_exception(ctx, self, SEXP_FIXNUM, arg1);
  if (! sexp_exact_integerp(arg2))
    return sexp_type_exception(ctx, self, SEXP_FIXNUM, arg2);
  if (!((-1 < sexp_sint_value(arg1)) && (sexp_sint_value(arg1) < sexp_bytes_length(arg0)))) {
    return sexp_user_exception_ls(ctx, self, "assertion failed: " "(< -1 arg1 (bytevector-length arg0))", 2, arg1, sexp_make_fixnum(sexp_bytes_length(arg0)));
  }
  res = ((bytevector_s8_set_x(sexp_bytes_data(arg0), sexp_sint_value(arg1), sexp_sint_value(arg2))), SEXP_VOID);
  return res;
}